

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O3

aiReturn __thiscall
Assimp::Exporter::Export
          (Exporter *this,aiScene *pScene,char *pFormatId,char *pPath,uint pPreprocessing,
          ExportProperties *pProperties)

{
  uint *puVar1;
  ProgressHandler *pPVar2;
  pointer pEVar3;
  void *pvVar4;
  BaseProcess *pBVar5;
  Exporter *pEVar6;
  undefined8 list;
  bool bVar7;
  int iVar8;
  long lVar9;
  long *plVar10;
  ExporterPimpl *pEVar11;
  Logger *this_00;
  int *piVar12;
  pointer ppBVar13;
  uint uVar14;
  _Base_ptr *pp_Var15;
  char *pcVar16;
  char *pcVar17;
  uint *puVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  unique_ptr<aiScene,_std::default_delete<aiScene>_> scenecopy;
  aiScene *scenecopy_tmp;
  ExportProperties emptyProperties;
  _Head_base<0UL,_aiScene_*,_false> local_140;
  uint local_138;
  uint local_134;
  Exporter *local_130;
  aiScene *local_128 [2];
  undefined1 local_118 [24];
  char *local_100;
  uint local_f4;
  undefined1 local_f0 [16];
  _Base_ptr local_e0;
  _Base_ptr p_Stack_d8;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  local_c0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
  local_60;
  
  bVar7 = true;
  local_138 = pPreprocessing;
  local_100 = pPath;
  if ((pScene->mFlags & 8) != 0) {
    bVar7 = MakeVerboseFormatProcess::IsVerboseFormat(pScene);
  }
  pPVar2 = this->pimpl->mProgressHandler;
  (*pPVar2->_vptr_ProgressHandler[5])(pPVar2,0,4);
  std::__cxx11::string::_M_replace
            ((ulong)&this->pimpl->mError,0,(char *)(this->pimpl->mError)._M_string_length,0x68cee4);
  local_134 = CONCAT31(local_134._1_3_,bVar7);
  pEVar3 = (this->pimpl->mExporters).
           super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->pimpl->mExporters).
                super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3;
  local_130 = this;
  if (lVar9 != 0) {
    local_118._16_8_ = (ExportProperties *)local_f0;
    if (pProperties != (ExportProperties *)0x0) {
      local_118._16_8_ = pProperties;
    }
    puVar18 = &pEVar3->mEnforcePP;
    uVar19 = 0;
    do {
      iVar8 = strcmp((((ExportFormatEntry *)(puVar18 + -8))->mDescription).id,pFormatId);
      if (iVar8 == 0) {
        local_128[0] = (aiScene *)0x0;
        SceneCombiner::CopyScene(local_128,pScene,true);
        pPVar2 = local_130->pimpl->mProgressHandler;
        (*pPVar2->_vptr_ProgressHandler[5])(pPVar2,1,4);
        pEVar6 = local_130;
        local_140._M_head_impl = local_128[0];
        pvVar4 = pScene->mPrivate;
        uVar14 = *puVar18;
        uVar21 = 0xffffffff;
        if ((pvVar4 != (void *)0x0) && (*(char *)((long)pvVar4 + 0xc) == '\0')) {
          uVar21 = ~*(uint *)((long)pvVar4 + 8) | 0x1800004;
        }
        uVar21 = uVar21 & (local_138 | uVar14);
        pEVar11 = local_130->pimpl;
        if ((char)local_134 != '\0') goto LAB_002efe15;
        ppBVar13 = (pEVar11->mPostProcessingSteps).
                   super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((pEVar11->mPostProcessingSteps).
            super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
            _M_impl.super__Vector_impl_data._M_finish == ppBVar13) goto LAB_002efe10;
        pcVar16 = (char *)0x0;
        pcVar17 = (char *)0x1;
        goto LAB_002efdd0;
      }
      uVar19 = uVar19 + 1;
      puVar18 = puVar18 + 10;
    } while (uVar19 < (ulong)((lVar9 >> 3) * -0x3333333333333333));
  }
  local_128[0] = (aiScene *)local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,"Found no exporter to handle this file format: ","");
  plVar10 = (long *)std::__cxx11::string::append((char *)local_128);
  pp_Var15 = (_Base_ptr *)(plVar10 + 2);
  if ((_Base_ptr *)*plVar10 == pp_Var15) {
    local_e0 = *pp_Var15;
    p_Stack_d8 = (_Base_ptr)plVar10[3];
    local_f0._0_8_ = &local_e0;
  }
  else {
    local_e0 = *pp_Var15;
    local_f0._0_8_ = (_Base_ptr *)*plVar10;
  }
  local_f0._8_8_ = plVar10[1];
  *plVar10 = (long)pp_Var15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_130->pimpl->mError,(string *)local_f0);
  if ((_Base_ptr *)local_f0._0_8_ != &local_e0) {
    operator_delete((void *)local_f0._0_8_,(ulong)((long)&local_e0->_M_color + 1));
  }
  if (local_128[0] != (aiScene *)local_118) {
    operator_delete(local_128[0],local_118._0_8_ + 1);
  }
  return aiReturn_FAILURE;
  while( true ) {
    pEVar11 = pEVar6->pimpl;
    ppBVar13 = (pEVar11->mPostProcessingSteps).
               super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    pFormatId = (char *)(ulong)((int)pcVar17 + 1);
    bVar7 = (char *)((long)(pEVar11->mPostProcessingSteps).
                           super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar13 >> 3) <=
            pcVar17;
    pcVar16 = pcVar17;
    pcVar17 = pFormatId;
    if (bVar7) break;
LAB_002efdd0:
    pBVar5 = ppBVar13[(long)pcVar16];
    iVar8 = (*pBVar5->_vptr_BaseProcess[2])(pBVar5,(ulong)uVar21);
    if (((char)iVar8 != '\0') &&
       (iVar8 = (*pBVar5->_vptr_BaseProcess[3])(pBVar5), pFormatId = pcVar17, (char)iVar8 != '\0'))
    goto LAB_002efe19;
  }
  uVar14 = *puVar18;
LAB_002efe10:
  if ((uVar14 & 2) == 0) {
LAB_002efe15:
    uVar14 = 0;
  }
  else {
LAB_002efe19:
    this_00 = DefaultLogger::get();
    Logger::debug(this_00,
                  "export: Scene data not in verbose format, applying MakeVerboseFormat step first")
    ;
    MakeVerboseFormatProcess::MakeVerboseFormatProcess((MakeVerboseFormatProcess *)local_f0);
    MakeVerboseFormatProcess::Execute((MakeVerboseFormatProcess *)local_f0,local_140._M_head_impl);
    uVar14 = (uint)CONCAT71((int7)((ulong)pFormatId >> 8),(*puVar18 & 2) == 0);
    MakeVerboseFormatProcess::~MakeVerboseFormatProcess((MakeVerboseFormatProcess *)local_f0);
    pEVar11 = pEVar6->pimpl;
  }
  (*pEVar11->mProgressHandler->_vptr_ProgressHandler[5])(pEVar11->mProgressHandler,2,4);
  if (uVar21 != 0) {
    FlipWindingOrderProcess::FlipWindingOrderProcess((FlipWindingOrderProcess *)local_f0);
    bVar7 = FlipWindingOrderProcess::IsActive((FlipWindingOrderProcess *)local_f0,uVar21);
    if (bVar7) {
      FlipWindingOrderProcess::Execute((FlipWindingOrderProcess *)local_f0,local_140._M_head_impl);
    }
    FlipWindingOrderProcess::~FlipWindingOrderProcess((FlipWindingOrderProcess *)local_f0);
    FlipUVsProcess::FlipUVsProcess((FlipUVsProcess *)local_f0);
    bVar7 = FlipUVsProcess::IsActive((FlipUVsProcess *)local_f0,uVar21);
    if (bVar7) {
      FlipUVsProcess::Execute((FlipUVsProcess *)local_f0,local_140._M_head_impl);
    }
    FlipUVsProcess::~FlipUVsProcess((FlipUVsProcess *)local_f0);
    MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)local_f0);
    bVar7 = MakeLeftHandedProcess::IsActive((MakeLeftHandedProcess *)local_f0,uVar21);
    if (bVar7) {
      MakeLeftHandedProcess::Execute((MakeLeftHandedProcess *)local_f0,local_140._M_head_impl);
    }
    MakeLeftHandedProcess::~MakeLeftHandedProcess((MakeLeftHandedProcess *)local_f0);
    local_134 = uVar14;
    if (pProperties == (ExportProperties *)0x0) {
      local_138 = CONCAT31(local_138._1_3_,1);
    }
    else {
      local_f0._0_8_ = local_f0._0_8_ & 0xffffffff00000000;
      piVar12 = GetGenericProperty<int>
                          (&pProperties->mIntProperties,"EXPORT_POINT_CLOUDS",(int *)local_f0);
      local_138 = CONCAT31(local_138._1_3_,*piVar12 == 0);
    }
    ppBVar13 = (pEVar6->pimpl->mPostProcessingSteps).
               super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pEVar6->pimpl->mPostProcessingSteps).
        super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppBVar13) {
      local_138 = CONCAT31(local_138._1_3_,~(byte)local_138);
      uVar19 = 0;
      uVar20 = 1;
      do {
        pBVar5 = ppBVar13[uVar19];
        iVar8 = (*pBVar5->_vptr_BaseProcess[2])(pBVar5,(ulong)uVar21);
        if (((((char)iVar8 != '\0') &&
             (lVar9 = __dynamic_cast(pBVar5,&BaseProcess::typeinfo,&FlipUVsProcess::typeinfo,0),
             lVar9 == 0)) &&
            (lVar9 = __dynamic_cast(pBVar5,&BaseProcess::typeinfo,&FlipWindingOrderProcess::typeinfo
                                    ,0), lVar9 == 0)) &&
           (lVar9 = __dynamic_cast(pBVar5,&BaseProcess::typeinfo,&MakeLeftHandedProcess::typeinfo,0)
           , lVar9 == 0)) {
          lVar9 = __dynamic_cast(pBVar5,&BaseProcess::typeinfo,&PretransformVertices::typeinfo,0);
          if (((byte)local_138 & lVar9 != 0) == 0) {
            (*pBVar5->_vptr_BaseProcess[5])(pBVar5,local_140._M_head_impl);
          }
        }
        ppBVar13 = (pEVar6->pimpl->mPostProcessingSteps).
                   super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        bVar7 = uVar20 < (ulong)((long)(pEVar6->pimpl->mPostProcessingSteps).
                                       super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar13
                                >> 3);
        uVar19 = uVar20;
        uVar20 = (ulong)((int)uVar20 + 1);
      } while (bVar7);
    }
    if (local_140._M_head_impl == (aiScene *)0x0) {
      __assert_fail("nullptr != in",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/ScenePrivate.h"
                    ,0x57,"ScenePrivateData *Assimp::ScenePriv(aiScene *)");
    }
    if ((local_140._M_head_impl)->mPrivate == (void *)0x0) {
      __assert_fail("nullptr != privOut",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Exporter.cpp"
                    ,0x1b2,
                    "aiReturn Assimp::Exporter::Export(const aiScene *, const char *, const char *, unsigned int, const ExportProperties *)"
                   );
    }
    puVar1 = (uint *)((long)(local_140._M_head_impl)->mPrivate + 8);
    *puVar1 = *puVar1 | uVar21;
    uVar14 = local_134;
  }
  pPVar2 = pEVar6->pimpl->mProgressHandler;
  (*pPVar2->_vptr_ProgressHandler[5])(pPVar2,3,4);
  pcVar16 = local_100;
  list = local_118._16_8_;
  if ((char)uVar14 != '\0') {
    JoinVerticesProcess::JoinVerticesProcess((JoinVerticesProcess *)local_f0);
    JoinVerticesProcess::Execute((JoinVerticesProcess *)local_f0,local_140._M_head_impl);
    JoinVerticesProcess::~JoinVerticesProcess((JoinVerticesProcess *)local_f0);
  }
  ExportProperties::ExportProperties((ExportProperties *)local_f0);
  local_f4 = uVar14 & 0xff;
  SetGenericProperty<int>
            ((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
              *)list,"bJoinIdenticalVertices",(int *)&local_f4);
  (**(fpExportFunc *)(puVar18 + -2))
            (pcVar16,(pEVar6->pimpl->mIOSystem).
                     super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_140._M_head_impl,(ExportProperties *)list);
  (**(fpExportFunc *)(puVar18 + -2))
            (pcVar16,(pEVar6->pimpl->mIOSystem).
                     super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_140._M_head_impl,(ExportProperties *)list);
  pPVar2 = pEVar6->pimpl->mProgressHandler;
  (*pPVar2->_vptr_ProgressHandler[5])(pPVar2,4,4);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
               *)local_f0);
  std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::~unique_ptr
            ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&local_140);
  return aiReturn_SUCCESS;
}

Assistant:

aiReturn Exporter::Export( const aiScene* pScene, const char* pFormatId, const char* pPath,
        unsigned int pPreprocessing, const ExportProperties* pProperties) {
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // when they create scenes from scratch, users will likely create them not in verbose
    // format. They will likely not be aware that there is a flag in the scene to indicate
    // this, however. To avoid surprises and bug reports, we check for duplicates in
    // meshes upfront.
    const bool is_verbose_format = !(pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) || MakeVerboseFormatProcess::IsVerboseFormat(pScene);

    pimpl->mProgressHandler->UpdateFileWrite(0, 4);

    pimpl->mError = "";
    for (size_t i = 0; i < pimpl->mExporters.size(); ++i) {
        const Exporter::ExportFormatEntry& exp = pimpl->mExporters[i];
        if (!strcmp(exp.mDescription.id,pFormatId)) {
            try {
                // Always create a full copy of the scene. We might optimize this one day,
                // but for now it is the most pragmatic way.
                aiScene* scenecopy_tmp = nullptr;
                SceneCombiner::CopyScene(&scenecopy_tmp,pScene);

                pimpl->mProgressHandler->UpdateFileWrite(1, 4);

                std::unique_ptr<aiScene> scenecopy(scenecopy_tmp);
                const ScenePrivateData* const priv = ScenePriv(pScene);

                // steps that are not idempotent, i.e. we might need to run them again, usually to get back to the
                // original state before the step was applied first. When checking which steps we don't need
                // to run, those are excluded.
                const unsigned int nonIdempotentSteps = aiProcess_FlipWindingOrder | aiProcess_FlipUVs | aiProcess_MakeLeftHanded;

                // Erase all pp steps that were already applied to this scene
                const unsigned int pp = (exp.mEnforcePP | pPreprocessing) & ~(priv && !priv->mIsCopy
                    ? (priv->mPPStepsApplied & ~nonIdempotentSteps)
                    : 0u);

                // If no extra post-processing was specified, and we obtained this scene from an
                // Assimp importer, apply the reverse steps automatically.
                // TODO: either drop this, or document it. Otherwise it is just a bad surprise.
                //if (!pPreprocessing && priv) {
                //  pp |= (nonIdempotentSteps & priv->mPPStepsApplied);
                //}

                // If the input scene is not in verbose format, but there is at least post-processing step that relies on it,
                // we need to run the MakeVerboseFormat step first.
                bool must_join_again = false;
                if (!is_verbose_format) {
                    bool verbosify = false;
                    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++) {
                        BaseProcess* const p = pimpl->mPostProcessingSteps[a];

                        if (p->IsActive(pp) && p->RequireVerboseFormat()) {
                            verbosify = true;
                            break;
                        }
                    }

                    if (verbosify || (exp.mEnforcePP & aiProcess_JoinIdenticalVertices)) {
                        ASSIMP_LOG_DEBUG("export: Scene data not in verbose format, applying MakeVerboseFormat step first");

                        MakeVerboseFormatProcess proc;
                        proc.Execute(scenecopy.get());

                        if(!(exp.mEnforcePP & aiProcess_JoinIdenticalVertices)) {
                            must_join_again = true;
                        }
                    }
                }

                pimpl->mProgressHandler->UpdateFileWrite(2, 4);

                if (pp) {
                    // the three 'conversion' steps need to be executed first because all other steps rely on the standard data layout
                    {
                        FlipWindingOrderProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    {
                        FlipUVsProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    {
                        MakeLeftHandedProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    bool exportPointCloud(false);
                    if (nullptr != pProperties) {
                        exportPointCloud = pProperties->GetPropertyBool(AI_CONFIG_EXPORT_POINT_CLOUDS);
                    }

                    // dispatch other processes
                    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++) {
                        BaseProcess* const p = pimpl->mPostProcessingSteps[a];

                        if (p->IsActive(pp)
                            && !dynamic_cast<FlipUVsProcess*>(p)
                            && !dynamic_cast<FlipWindingOrderProcess*>(p)
                            && !dynamic_cast<MakeLeftHandedProcess*>(p)) {
                            if (dynamic_cast<PretransformVertices*>(p) && exportPointCloud) {
                                continue;
                            }
                            p->Execute(scenecopy.get());
                        }
                    }
                    ScenePrivateData* const privOut = ScenePriv(scenecopy.get());
                    ai_assert(nullptr != privOut);

                    privOut->mPPStepsApplied |= pp;
                }

                pimpl->mProgressHandler->UpdateFileWrite(3, 4);

                if(must_join_again) {
                    JoinVerticesProcess proc;
                    proc.Execute(scenecopy.get());
                }

                ExportProperties emptyProperties;  // Never pass NULL ExportProperties so Exporters don't have to worry.
                ExportProperties* pProp = pProperties ? (ExportProperties*)pProperties : &emptyProperties;
                                pProp->SetPropertyBool("bJoinIdenticalVertices", must_join_again);
                                exp.mExportFunction(pPath,pimpl->mIOSystem.get(),scenecopy.get(), pProp);
                exp.mExportFunction(pPath,pimpl->mIOSystem.get(),scenecopy.get(), pProp);

                pimpl->mProgressHandler->UpdateFileWrite(4, 4);
            } catch (DeadlyExportError& err) {
                pimpl->mError = err.what();
                return AI_FAILURE;
            }
            return AI_SUCCESS;
        }
    }

    pimpl->mError = std::string("Found no exporter to handle this file format: ") + pFormatId;
    ASSIMP_END_EXCEPTION_REGION(aiReturn);

    return AI_FAILURE;
}